

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL_mock::MockGLEngine::initializeImGui(MockGLEngine *this)

{
  ImGuiIO *pIVar1;
  int tex_h;
  int tex_w;
  uchar *tex_pixels;
  int local_20;
  int local_1c;
  uchar *local_18;
  
  ImGui::CreateContext((ImFontAtlas *)0x0);
  pIVar1 = ImGui::GetIO();
  local_18 = (uchar *)0x0;
  ImFontAtlas::GetTexDataAsRGBA32(pIVar1->Fonts,&local_18,&local_1c,&local_20,(int *)0x0);
  Engine::setImGuiStyle(&this->super_Engine);
  (this->super_Engine).globalFontAtlas = pIVar1->Fonts;
  return;
}

Assistant:

void MockGLEngine::initializeImGui() {

  ImGui::CreateContext(); // must call once at start

  // Set up ImGUI glfw bindings

  // Build a fake font atlas for mocking
  ImGuiIO& io = ImGui::GetIO();
  unsigned char* tex_pixels = NULL;
  int tex_w, tex_h;
  io.Fonts->GetTexDataAsRGBA32(&tex_pixels, &tex_w, &tex_h);

  // io.OptResizeWindowsFromEdges = true;
  // ImGui::StyleColorsLight();
  setImGuiStyle();

  globalFontAtlas = io.Fonts;
}